

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20240722::debugging_internal::ParseOneCharToken(State *state,char one_char_token)

{
  bool bVar1;
  char *pcVar2;
  ComplexityGuard local_28;
  ComplexityGuard guard;
  char one_char_token_local;
  State *state_local;
  
  guard.state_._7_1_ = one_char_token;
  anon_unknown_3::ComplexityGuard::ComplexityGuard(&local_28,state);
  bVar1 = anon_unknown_3::ComplexityGuard::IsTooComplex(&local_28);
  if (bVar1) {
    state_local._7_1_ = false;
  }
  else {
    pcVar2 = RemainingInput(state);
    if (*pcVar2 == guard.state_._7_1_) {
      (state->parse_state).mangled_idx = (state->parse_state).mangled_idx + 1;
      anon_unknown_3::UpdateHighWaterMark(state);
      state_local._7_1_ = true;
    }
    else {
      state_local._7_1_ = false;
    }
  }
  anon_unknown_3::ComplexityGuard::~ComplexityGuard(&local_28);
  return state_local._7_1_;
}

Assistant:

static bool ParseOneCharToken(State *state, const char one_char_token) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (RemainingInput(state)[0] == one_char_token) {
    ++state->parse_state.mangled_idx;
    UpdateHighWaterMark(state);
    return true;
  }
  return false;
}